

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_websocket.hpp
# Opt level: O2

void __thiscall
m2d::savanna::async_websocket::
reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
::on_read(reuse_websocket_executor<std::shared_ptr<boost::beast::websocket::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>_>_>
          *this,error_code ec,flat_buffer *buffer,size_t bytes_transferred)

{
  reference_type __x;
  function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)> handler;
  function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)> fStack_38;
  
  if ((ec._0_8_ >> 0x20 & 1) == 0) {
    if ((this->on_message_handler_).super_type.m_initialized == true) {
      __x = boost::
            optional<std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>_>
            ::get(&this->on_message_handler_);
      std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>::function
                (&fStack_38,__x);
      std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>::operator()
                (&fStack_38,buffer);
      std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
    }
    (*((this->interface_).
       super___shared_ptr<m2d::savanna::async_websocket::interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_interface[0xe])();
    return;
  }
  (*(this->super_delegate)._vptr_delegate[3])(this,ec._0_8_,ec.cat_);
  return;
}

Assistant:

void on_read(beast::error_code ec, beast::flat_buffer buffer, std::size_t bytes_transferred) override
			{
				boost::ignore_unused(bytes_transferred);

				if (ec) {
					on_error(ec);
					return;
				}

				if (on_message_handler_) {
					auto handler = *on_message_handler_;
					handler(buffer);
				}

				interface_->read();
			}